

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  IReporterFactory *pIVar1;
  IStreamingReporter *pIVar2;
  NonCopyable NVar3;
  Catch *pCVar4;
  IStreamingReporter *pIVar5;
  int iVar6;
  IRegistryHub *pIVar7;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pPVar8;
  Listeners listeners;
  Ptr<Catch::IStreamingReporter> local_70;
  undefined8 local_68;
  IConfig *local_60;
  Catch *local_58;
  IStreamingReporter *local_50;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  local_48;
  
  local_58 = this;
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[2])(pIVar7);
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar6));
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector(&local_48,__x);
  if (local_48.
      super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pPVar8 = local_48.
             super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pIVar1 = pPVar8->m_p;
      iVar6 = (*(config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
      local_68 = CONCAT44(extraout_var_00,iVar6);
      local_60 = config->m_p;
      if (local_60 != (IConfig *)0x0) {
        (*(local_60->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
      }
      iVar6 = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar1,&local_68);
      local_70.m_p = (IStreamingReporter *)CONCAT44(extraout_var_01,iVar6);
      if (local_70.m_p != (IStreamingReporter *)0x0) {
        (*((local_70.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_70.m_p);
      }
      addReporter((Catch *)&local_50,reporters,&local_70);
      pIVar5 = local_50;
      if (local_50 != (IStreamingReporter *)0x0) {
        (*(local_50->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_50);
      }
      pIVar2 = reporters->m_p;
      reporters->m_p = pIVar5;
      if (pIVar2 != (IStreamingReporter *)0x0) {
        (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      if (pIVar5 != (IStreamingReporter *)0x0) {
        (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar5);
      }
      if (local_70.m_p != (IStreamingReporter *)0x0) {
        (*((local_70.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      if (local_60 != (IConfig *)0x0) {
        (*(local_60->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != local_48.
                       super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar4 = local_58;
  NVar3._vptr_NonCopyable = (_func_int **)reporters->m_p;
  *(_func_int ***)local_58 = NVar3._vptr_NonCopyable;
  if ((NonCopyable)NVar3._vptr_NonCopyable != (NonCopyable)0x0) {
    (**(code **)(*NVar3._vptr_NonCopyable + 0x10))();
  }
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector(&local_48);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)pCVar4;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }